

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O3

void * QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)

{
  char cVar1;
  long lVar2;
  
  cVar1 = QSurface::supportsOpenGL();
  if ((cVar1 == '\0') || (lVar2 = QWindow::handle(), lVar2 != 0)) {
    cVar1 = QSurface::supportsOpenGL();
    if (cVar1 == '\0') {
      return (void *)0x0;
    }
    lVar2 = QWindow::handle();
    lVar2 = *(long *)(lVar2 + 0xe0);
  }
  else {
    lVar2 = QXcbConnection::glIntegration();
  }
  return *(void **)(lVar2 + 0x18);
}

Assistant:

void *QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)
{
    Q_ASSERT(window);
    if (window->supportsOpenGL() && window->handle() == nullptr)
        return eglDisplay();
    else if (window->supportsOpenGL())
        return static_cast<QXcbEglWindow *>(window->handle())->glIntegration()->eglDisplay();
    return nullptr;
}